

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

void PostProcess(Mat *frame,vector<cv::Mat,_std::allocator<cv::Mat>_> *outs,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *classes,double *confThreshold,double *nmsThreshold)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _InputArray *p_Var4;
  ulong uVar5;
  long lVar6;
  pointer pMVar7;
  undefined8 *puVar8;
  size_t i;
  int iVar9;
  double confidence;
  Point classIdPoint;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boxes;
  vector<float,_std::allocator<float>_> confidences;
  vector<int,_std::allocator<int>_> classIds;
  int local_128;
  int iStack_124;
  float local_118;
  float fStack_114;
  float local_108;
  float fStack_104;
  Rect box;
  vector<int,_std::allocator<int>_> indices;
  
  classIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  classIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  classIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar7 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)(outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar7) / 0x60);
      uVar5 = uVar5 + 1) {
    lVar6 = uVar5 * 0x60;
    puVar8 = *(undefined8 **)(pMVar7 + lVar6 + 0x10);
    for (iVar9 = 0; iVar9 < *(int *)(pMVar7 + lVar6 + 8); iVar9 = iVar9 + 1) {
      cv::Mat::row((Mat *)&box,(int)pMVar7 + (int)lVar6);
      cv::Mat::colRange((Mat *)&indices,(int)(_InputArray *)&box,5);
      cv::Mat::~Mat((Mat *)&box);
      classIdPoint.x = 0;
      classIdPoint.y = 0;
      box.x = 0x1010000;
      box._8_8_ = (Mat *)&indices;
      p_Var4 = (_InputArray *)cv::noArray();
      cv::minMaxLoc((_InputArray *)&box,(double *)0x0,&confidence,(Point_ *)0x0,
                    (Point_ *)&classIdPoint,p_Var4);
      if (*confThreshold <= (double)CONCAT44(confidence._4_4_,confidence._0_4_) &&
          (double)CONCAT44(confidence._4_4_,confidence._0_4_) != *confThreshold) {
        uVar1 = *(undefined8 *)(frame + 8);
        uVar2 = *puVar8;
        uVar3 = puVar8[1];
        std::vector<int,_std::allocator<int>_>::push_back(&classIds,&classIdPoint.x);
        box.x = (int)(float)(double)CONCAT44(confidence._4_4_,confidence._0_4_);
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&confidences,(float *)&box);
        local_128 = (int)uVar1;
        iStack_124 = (int)((ulong)uVar1 >> 0x20);
        local_118 = (float)uVar2;
        fStack_114 = (float)((ulong)uVar2 >> 0x20);
        local_108 = (float)uVar3;
        fStack_104 = (float)((ulong)uVar3 >> 0x20);
        box.width = (int)(local_108 * (float)iStack_124);
        box.height = (int)(fStack_104 * (float)local_128);
        box.x = (int)(local_118 * (float)iStack_124) - box.width / 2;
        box.y = (int)(fStack_114 * (float)local_128) - box.height / 2;
        std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>::emplace_back<cv::Rect_<int>>
                  ((vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>> *)&boxes,
                   (Rect_<int> *)&box);
      }
      cv::Mat::~Mat((Mat *)&indices);
      pMVar7 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = (undefined8 *)((long)puVar8 + (long)*(int *)(pMVar7 + lVar6 + 0xc) * 4);
    }
  }
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  cv::dnn::dnn4_v20211004::NMSBoxes
            ((vector *)&boxes,(vector *)&confidences,(float)*confThreshold,(float)*nmsThreshold,
             (vector *)&indices,1.0,0);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    iVar9 = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar5];
    box.x = boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9].x;
    box.y = boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9].y;
    box.height = boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9].height;
    box.width = boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                super__Vector_impl_data._M_start[iVar9].width;
    classIdPoint.x =
         boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
         super__Vector_impl_data._M_start[iVar9].width + box.x;
    confidence._0_4_ =
         boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
         super__Vector_impl_data._M_start[iVar9].height + box.y;
    DrawPred((classes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start +
             classIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[iVar9],
             confidences.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + iVar9,&box.x,&box.y,&classIdPoint.x,
             (int *)&confidence,frame);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indices.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&boxes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&confidences.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&classIds.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void PostProcess(cv::Mat& frame, std::vector<cv::Mat> const& outs, std::vector<std::string> const& classes,
    double const& confThreshold, double const& nmsThreshold) noexcept {
  std::vector<int> classIds;
  std::vector<float> confidences;
  std::vector<cv::Rect> boxes;
  
  for (size_t i = 0; i < outs.size(); ++i) {
    /** Scan through all the bounding boxes output from the network and keep only the
     * ones with high confidence scores. Assign the box's class label as the class
     * with the highest score for the box.*/
    float* data = (float*)outs[i].data;
    for (int j = 0; j < outs[i].rows; ++j, data += outs[i].cols) {
      cv::Mat scores = outs[i].row(j).colRange(5, outs[i].cols);
      cv::Point classIdPoint;
      double confidence;
      //! Get the value and location of the maximum score
      cv::minMaxLoc(scores, 0, &confidence, 0, &classIdPoint);
      if (confidence > confThreshold) {
        int centerX = (int)(data[0] * frame.cols);
        int centerY = (int)(data[1] * frame.rows);
        int width = (int)(data[2] * frame.cols);
        int height = (int)(data[3] * frame.rows);
        int left = centerX - width / 2;
        int top = centerY - height / 2;
      
        classIds.push_back(classIdPoint.x);
        confidences.push_back((float)confidence);
        boxes.push_back(cv::Rect(left, top, width, height));
      }
    }
  }
  
  /** Perform non maximum suppression to eliminate redundant overlapping boxes with
   * lower confidences */
  std::vector<int> indices;
  cv::dnn::NMSBoxes(boxes, confidences, confThreshold, nmsThreshold, indices);
  for (size_t i = 0; i < indices.size(); ++i) {
    int idx = indices[i];
    cv::Rect box = boxes[idx];
    DrawPred(classes[classIds[idx]], confidences[idx], box.x, box.y,
        box.x + box.width, box.y + box.height, frame);
  }
}